

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

bool __thiscall DCanvas::ClipBox(DCanvas *this,int *x,int *y,int *w,int *h,BYTE **src,int srcpitch)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = *x;
  iVar7 = this->Width;
  bVar2 = true;
  bVar3 = true;
  if ((iVar6 < iVar7) && (iVar1 = *y, bVar3 = bVar2, iVar1 < this->Height)) {
    iVar4 = *w;
    iVar5 = iVar4 + iVar6;
    if ((iVar5 != 0 && SCARRY4(iVar4,iVar6) == iVar5 < 0) &&
       (iVar1 + *h != 0 && SCARRY4(iVar1,*h) == iVar1 + *h < 0)) {
      if (iVar6 < 0) {
        *src = *src + -(long)iVar6;
        *w = iVar5;
        *x = 0;
        iVar4 = *w;
        iVar7 = this->Width;
        iVar6 = 0;
      }
      if (iVar7 < iVar4 + iVar6) {
        *w = iVar7 - iVar6;
      }
      iVar6 = *y;
      iVar7 = *h;
      if (iVar6 < 0) {
        *src = *src + -(long)(iVar6 * srcpitch);
        *h = iVar7 + iVar6;
        *y = 0;
        iVar7 = *h;
        iVar6 = 0;
      }
      if (this->Height < iVar7 + iVar6) {
        *h = this->Height - iVar6;
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool DCanvas::ClipBox (int &x, int &y, int &w, int &h, const BYTE *&src, const int srcpitch) const
{
	if (x >= Width || y >= Height || x+w <= 0 || y+h <= 0)
	{ // Completely clipped off screen
		return true;
	}
	if (x < 0)				// clip left edge
	{
		src -= x;
		w += x;
		x = 0;
	}
	if (x+w > Width)		// clip right edge
	{
		w = Width - x;
	}
	if (y < 0)				// clip top edge
	{
		src -= y*srcpitch;
		h += y;
		y = 0;
	}
	if (y+h > Height)		// clip bottom edge
	{
		h = Height - y;
	}
	return false;
}